

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O3

void __thiscall
btSoftColliders::CollideCL_RS::ProcessColObj
          (CollideCL_RS *this,btSoftBody *ps,btCollisionObjectWrapper *colObWrap)

{
  float fVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar2;
  btVector3 maxs;
  btVector3 mins;
  btDbvtAabbMm box;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  btDbvtVolume local_68 [2];
  
  this->psb = ps;
  this->m_colObjWrap = colObWrap;
  (this->super_ClusterBase).idt = (ps->m_sst).isdt;
  (*colObWrap->m_shape->_vptr_btCollisionShape[0xc])();
  (*((this->psb->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  (this->super_ClusterBase).m_margin = extraout_XMM0_Da_00 + extraout_XMM0_Da;
  fVar2 = (this->psb->m_cfg).kDF;
  fVar1 = this->m_colObjWrap->m_collisionObject->m_friction;
  if (fVar1 <= fVar2) {
    fVar2 = fVar1;
  }
  (this->super_ClusterBase).friction = fVar2;
  (*colObWrap->m_shape->_vptr_btCollisionShape[2])
            (colObWrap->m_shape,colObWrap->m_worldTransform,local_78,local_88);
  fVar2 = (this->super_ClusterBase).m_margin;
  local_68[0].mi.m_floats[1] = SUB84(local_78._0_8_,4) - fVar2;
  local_68[0].mi.m_floats[0] = (float)local_78._0_8_ - fVar2;
  local_68[0].mi.m_floats[2] = (btScalar)local_78._8_8_;
  local_68[0].mi.m_floats[3] = SUB84(local_78._8_8_,4);
  local_68[0].mi.m_floats[2] = local_68[0].mi.m_floats[2] - fVar2;
  local_68[0].mx.m_floats[1] = SUB84(local_88._0_8_,4) + fVar2;
  local_68[0].mx.m_floats[0] = (float)local_88._0_8_ + fVar2;
  local_68[0].mx.m_floats[2] = (btScalar)local_88._8_8_;
  local_68[0].mx.m_floats[3] = SUB84(local_88._8_8_,4);
  local_68[0].mx.m_floats[2] = fVar2 + local_68[0].mx.m_floats[2];
  btDbvt::collideTV(&ps->m_cdbvt,(ps->m_cdbvt).m_root,local_68,(ICollide *)this);
  return;
}

Assistant:

void		ProcessColObj(btSoftBody* ps,const btCollisionObjectWrapper* colObWrap)
		{
			psb			=	ps;
			m_colObjWrap			=	colObWrap;
			idt			=	ps->m_sst.isdt;
			m_margin		=	m_colObjWrap->getCollisionShape()->getMargin()+psb->getCollisionShape()->getMargin();
			///Bullet rigid body uses multiply instead of minimum to determine combined friction. Some customization would be useful.
			friction	=	btMin(psb->m_cfg.kDF,m_colObjWrap->getCollisionObject()->getFriction());
			btVector3			mins;
			btVector3			maxs;

			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume;
			colObWrap->getCollisionShape()->getAabb(colObWrap->getWorldTransform(),mins,maxs);
			volume=btDbvtVolume::FromMM(mins,maxs);
			volume.Expand(btVector3(1,1,1)*m_margin);
			ps->m_cdbvt.collideTV(ps->m_cdbvt.m_root,volume,*this);
		}